

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O3

void __thiscall Js::Profiler::MergeTree(Profiler *this,TypeNode *toNode,TypeNode *fromNode)

{
  TypeNode *fromNode_00;
  TreeNode<Js::UnitData,_373> *toNode_00;
  TypeNode *fromChild;
  long lVar1;
  
  (toNode->value).count = (toNode->value).count + (fromNode->value).count;
  lVar1 = (fromNode->value).excl;
  (toNode->value).incl = (toNode->value).incl + (fromNode->value).incl;
  (toNode->value).excl = (toNode->value).excl + lVar1;
  lVar1 = (fromNode->value).max;
  if ((toNode->value).max < lVar1) {
    (toNode->value).max = lVar1;
  }
  lVar1 = 4;
  do {
    fromNode_00 = fromNode->children[lVar1 + -4];
    if (fromNode_00 != (TypeNode *)0x0) {
      toNode_00 = toNode->children[lVar1 + -4];
      if (toNode_00 == (TreeNode<Js::UnitData,_373> *)0x0) {
        toNode_00 = (TreeNode<Js::UnitData,_373> *)
                    new<Memory::ArenaAllocator>(0xbd0,this->alloc,0x364470);
        UnitData::UnitData((UnitData *)toNode_00);
        toNode_00->parent = toNode;
        memset(toNode_00->children,0,0xba8);
        toNode->children[lVar1 + -4] = toNode_00;
      }
      MergeTree(this,toNode_00,fromNode_00);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x179);
  return;
}

Assistant:

void
    Profiler::MergeTree(TypeNode * toNode, TypeNode * fromNode)
    {
        UnitData * toData = toNode->GetValue();
        const UnitData * fromData = fromNode->GetValue();

        toData->count += fromData->count;
        toData->incl += fromData->incl;
        toData->excl += fromData->excl;
        if (fromData->max > toData->max)
        {
            toData->max = fromData->max;
        }
        for (int i = 0; i < PhaseCount; i++)
        {
            if (fromNode->ChildExistsAt(i))
            {
                TypeNode * fromChild = fromNode->GetChildAt(i);
                TypeNode * toChild;
                if (!toNode->ChildExistsAt(i))
                {
                    toChild = Anew(this->alloc, TypeNode, toNode);
                    toNode->SetChildAt(i, toChild);
                }
                else
                {
                    toChild = toNode->GetChildAt(i);
                }
                MergeTree(toChild, fromChild);
            }
        }
    }